

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false>::Block
          (Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false> *this,
          Matrix<double,_4,_1,_0,_4,_1> *xpr,Index a_startRow,Index a_startCol,Index blockRows,
          Index blockCols)

{
  internal::BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_-1,_1,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_4,_1,_0,_4,_1>,__1,_1,_false,_true> *)this,
                  xpr,a_startRow,a_startCol,blockRows,blockCols);
  if (blockCols != 1) {
    __assert_fail("(RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows) && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                  ,0x8b,
                  "Eigen::Block<Eigen::Matrix<double, 4, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, 4, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  if (((-1 < (blockRows | a_startRow)) && (a_startCol == 0)) && (a_startRow <= 4 - blockRows)) {
    return;
  }
  __assert_fail("a_startRow >= 0 && blockRows >= 0 && a_startRow <= xpr.rows() - blockRows && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/Block.h"
                ,0x8d,
                "Eigen::Block<Eigen::Matrix<double, 4, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, 4, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

inline Block(XprType& xpr,
          Index a_startRow, Index a_startCol,
          Index blockRows, Index blockCols)
      : Impl(xpr, a_startRow, a_startCol, blockRows, blockCols)
    {
      eigen_assert((RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows)
          && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols));
      eigen_assert(a_startRow >= 0 && blockRows >= 0 && a_startRow  <= xpr.rows() - blockRows
          && a_startCol >= 0 && blockCols >= 0 && a_startCol <= xpr.cols() - blockCols);
    }